

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O0

void part_download(string *download_address,string *file_name,Task *task,
                  queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *taskMessageQueue)

{
  int iVar1;
  char *__filename;
  FILE *pFVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char local_78 [4];
  int result;
  char range_string [60];
  CURL *curl;
  FILE *file;
  queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *taskMessageQueue_local;
  Task *task_local;
  string *file_name_local;
  string *download_address_local;
  
  taskMessageQueue_local = (queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *)task;
  task_local = (Task *)file_name;
  file_name_local = download_address;
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(__filename,"rb+");
  fseeko(pFVar2,(__off_t)(taskMessageQueue_local->c).
                         super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_first,0);
  uVar3 = curl_easy_init();
  unique0x10000435 = uVar3;
  uVar4 = std::__cxx11::string::c_str();
  curl_easy_setopt(uVar3,0x2712,uVar4);
  sprintf(local_78,"%ld-%ld",
          (taskMessageQueue_local->c).super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first,
          (taskMessageQueue_local->c).super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last);
  curl_easy_setopt(stack0xffffffffffffffc8,0x2717,local_78);
  uVar3 = stack0xffffffffffffffc8;
  uVar4 = std::__cxx11::string::c_str();
  curl_easy_setopt(uVar3,0x2714,uVar4);
  curl_easy_setopt(stack0xffffffffffffffc8,0x2711,pFVar2);
  curl_easy_setopt(stack0xffffffffffffffc8,0x4efb,progress_callback);
  curl_easy_setopt(stack0xffffffffffffffc8,0x13,100);
  curl_easy_setopt(stack0xffffffffffffffc8,0x14,5);
  curl_easy_setopt(stack0xffffffffffffffc8,0x2749,taskMessageQueue_local);
  curl_easy_setopt(stack0xffffffffffffffc8,0x2b,0);
  iVar1 = curl_easy_perform(stack0xffffffffffffffc8);
  fclose(pFVar2);
  if (iVar1 == 0) {
    *(undefined2 *)
     &taskMessageQueue_local[1].c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
      super__Deque_impl_data._M_map = 2;
    curl_easy_getinfo(stack0xffffffffffffffc8,0x600009,
                      &taskMessageQueue_local[1].c.
                       super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
                       super__Deque_impl_data._M_start);
  }
  else {
    *(undefined2 *)
     &taskMessageQueue_local[1].c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
      super__Deque_impl_data._M_map = 3;
    pFVar2 = _stderr;
    uVar3 = curl_easy_strerror(iVar1);
    fprintf(pFVar2,"\rerror:%s\n",uVar3);
    taskMessageQueue_local[1].c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0xffffffffffffffff;
  }
  pthread_mutex_lock((pthread_mutex_t *)&messageLock);
  std::queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_>::push
            (taskMessageQueue,(value_type *)&taskMessageQueue_local);
  pthread_mutex_unlock((pthread_mutex_t *)&messageLock);
  curl_easy_cleanup(stack0xffffffffffffffc8);
  return;
}

Assistant:

void
part_download(const string &download_address, const string &file_name, Task *task, queue<Task *> *taskMessageQueue) {
    // rb+ explanation: open in this mode, the file won't get destroyed. But it requires a long enough file in advance.
    FILE *file = fopen(file_name.c_str(), "rb+");
    // fseeko can take larger param as position up to 64 bytes integer.
    fseeko(file, task->start, SEEK_SET);
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, download_address.c_str());
    char range_string[60]; // maybe 60 is just enough...
    sprintf(range_string, "%ld-%ld", task->start, task->end);
    curl_easy_setopt(curl, CURLOPT_RANGE, range_string);
    curl_easy_setopt(curl, CURLOPT_PROXY, task->proxy_server.address.c_str());
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, file);
    curl_easy_setopt(curl, CURLOPT_XFERINFOFUNCTION, progress_callback);
    // warning: the download will abort when meet low speed problem.
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, LOWEST_SPEED_BPS);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, 5);
    curl_easy_setopt(curl, CURLOPT_XFERINFODATA, task);
    curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0L);
    // bytes per second
    int result = curl_easy_perform(curl);
    fclose(file);
    if (result != CURLE_OK) {
        task->status = STATUS_ERROR;
        fprintf(stderr, "\rerror:%s\n", curl_easy_strerror((CURLcode) result));
        task->speed = -1;// this is not enough. Error handling will happens on the top of these code.
    } else {
        task->status = STATUS_COMPLETE;
        curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD_T, &(task->speed));
    }
    pthread_mutex_lock(&messageLock);
    taskMessageQueue->push(task);
    pthread_mutex_unlock(&messageLock);
    curl_easy_cleanup(curl);
}